

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

wl_display * glfwGetWaylandDisplay(void)

{
  wl_display *local_10;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_10 = (wl_display *)0x0;
  }
  else if (_glfw.platform.platformID == 0x60003) {
    local_10 = _glfw.wl.display;
  }
  else {
    _glfwInputError(0x1000e,"Wayland: Platform not initialized");
    local_10 = (wl_display *)0x0;
  }
  return local_10;
}

Assistant:

wl_display* glfwGetWaylandDisplay(void)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (_glfw.platform.platformID != GLFW_PLATFORM_WAYLAND)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE,
                        "Wayland: Platform not initialized");
        return NULL;
    }

    return _glfw.wl.display;
}